

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerselect.c
# Opt level: O2

int get_valid_genders(nh_roles_info *ri,int rolenum,int racenum,int alignnum,nh_listitem *list,
                     int listlen)

{
  int iVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = 0;
  for (lVar2 = 0; lVar2 < ri->num_genders; lVar2 = lVar2 + 1) {
    iVar1 = is_valid_character(ri,rolenum,racenum,(int)lVar2,alignnum);
    if (iVar1 != 0) {
      if (iVar3 < listlen && list != (nh_listitem *)0x0) {
        strcpy(list[iVar3].caption,ri->gendnames[lVar2]);
        list[iVar3].id = (int)lVar2;
      }
      iVar3 = iVar3 + 1;
    }
  }
  return iVar3;
}

Assistant:

static int get_valid_genders(const struct nh_roles_info *ri, int rolenum,
			   int racenum, int alignnum, struct nh_listitem *list, int listlen)
{
    int i;
    int count = 0;
    
    for (i = 0; i < ri->num_genders; i++) {
	if (!is_valid_character(ri, rolenum, racenum, i, alignnum))
	    continue;
	
	if (list && count < listlen) {
	    strcpy(list[count].caption, ri->gendnames[i]);
	    list[count].id = i;
	}
	count++;
    }
    return count;
}